

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O2

bool __thiscall
crnlib::qdxt1::pack(qdxt1 *this,dxt1_block *pDst_elements,uint elements_per_block,
                   qdxt1_params *params,float quality_power_mul)

{
  task_pool *ptVar1;
  byte bVar2;
  uint uVar3;
  crn_thread_id_t cVar4;
  uint uVar5;
  uint i_2;
  uint uVar6;
  uint i_1;
  uint uVar7;
  long lVar8;
  uint i;
  ulong uVar9;
  vector<crnlib::vector<unsigned_int>_> *pvVar10;
  float __x;
  float fVar11;
  float fVar12;
  optimize_selectors_params optimize_selectors_task_params;
  
  cVar4 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar4;
  this->m_canceled = false;
  this->m_pDst_elements = pDst_elements;
  this->m_elements_per_block = elements_per_block;
  memcpy(&this->m_params,params,0x630);
  if ((this->m_params).m_use_alpha_blocks == false) {
    (this->m_params).m_dxt1a_alpha_threshold = 0;
  }
  this->m_prev_percentage_complete = -1;
  __x = (float)(this->m_params).m_quality_level / 255.0;
  fVar11 = powf(__x,quality_power_mul * 1.8);
  fVar12 = powf(__x,quality_power_mul * 1.65);
  uVar6 = this->m_max_selector_clusters;
  uVar7 = (uint)(long)((float)uVar6 * fVar12);
  if (uVar7 < uVar6) {
    uVar6 = uVar7;
  }
  if (uVar7 < 0x80) {
    uVar6 = 0x80;
  }
  if (__x < 1.0) {
    uVar7 = (this->m_endpoint_clusterizer).m_codebook.m_size;
    uVar5 = (uint)(long)(fVar11 * (float)uVar7);
    if (uVar5 < uVar7) {
      uVar7 = uVar5;
    }
    uVar3 = 0x60;
    if (0x5f < uVar5) {
      uVar3 = uVar7;
    }
    clusterizer<crnlib::vec<6U,_float>_>::retrieve_clusters
              (&this->m_endpoint_clusterizer,uVar3,&this->m_endpoint_cluster_indices);
    pvVar10 = this->m_cached_selector_cluster_indices + params->m_quality_level;
    this->m_progress_start = 0;
  }
  else {
    pvVar10 = &this->m_endpoint_cluster_indices;
    lVar8 = 0;
    vector<crnlib::vector<unsigned_int>_>::resize(pvVar10,this->m_num_blocks,false);
    for (uVar9 = 0; uVar9 < this->m_num_blocks; uVar9 = uVar9 + 1) {
      vector<unsigned_int>::resize
                ((vector<unsigned_int> *)((long)&pvVar10->m_p->m_p + lVar8),1,false);
      **(undefined4 **)((long)&pvVar10->m_p->m_p + lVar8) = (int)uVar9;
      lVar8 = lVar8 + 0x10;
    }
    uVar7 = params->m_quality_level;
    this->m_progress_start = 0;
    pvVar10 = this->m_cached_selector_cluster_indices + uVar7;
    if (1.0 <= __x) {
      this->m_progress_range = 100;
      goto LAB_0012af92;
    }
  }
  if (pvVar10->m_size == 0) {
    uVar3 = 0x21;
  }
  else {
    uVar3 = 0x32;
  }
  if ((this->m_params).m_dxt_quality == cCRNDXTQualitySuperFast) {
    uVar3 = 10;
  }
  this->m_progress_range = uVar3;
LAB_0012af92:
  for (uVar7 = 0; ptVar1 = this->m_pTask_pool, uVar7 <= ptVar1->m_num_threads; uVar7 = uVar7 + 1) {
    task_pool::queue_object_task<crnlib::qdxt1,void(crnlib::qdxt1::*)(unsigned_long_long,void*)>
              (ptVar1,this,0x12a242,0,(void *)(ulong)uVar7);
  }
  task_pool::join(ptVar1);
  bVar2 = this->m_canceled;
  if (__x < 1.0 && (bool)bVar2 == false) {
    if ((pvVar10->m_size == 0) &&
       (create_selector_clusters(this,uVar6,pvVar10), this->m_canceled == true)) {
      vector<crnlib::vector<unsigned_int>_>::clear(pvVar10);
      return false;
    }
    uVar3 = this->m_progress_start + this->m_progress_range;
    this->m_progress_start = uVar3;
    this->m_progress_range = 100 - uVar3;
    for (uVar6 = 0; ptVar1 = this->m_pTask_pool, uVar6 <= ptVar1->m_num_threads; uVar6 = uVar6 + 1)
    {
      task_pool::queue_object_task<crnlib::qdxt1,void(crnlib::qdxt1::*)(unsigned_long_long,void*)>
                (ptVar1,this,0x12a89e,0,(void *)(ulong)uVar6);
    }
    task_pool::join(ptVar1);
    bVar2 = this->m_canceled;
  }
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool qdxt1::pack(dxt1_block* pDst_elements, uint elements_per_block, const qdxt1_params& params, float quality_power_mul)
    {
        CRNLIB_ASSERT(m_num_blocks);

        m_main_thread_id = crn_get_current_thread_id();
        m_canceled = false;

        m_pDst_elements = pDst_elements;
        m_elements_per_block = elements_per_block;
        m_params = params;
        if (!m_params.m_use_alpha_blocks)
        {
            m_params.m_dxt1a_alpha_threshold = 0;
        }

        m_prev_percentage_complete = -1;

        CRNLIB_ASSERT(m_params.m_quality_level <= qdxt1_params::cMaxQuality);
        const float quality = m_params.m_quality_level / (float)qdxt1_params::cMaxQuality;
        const float endpoint_quality = powf(quality, 1.8f * quality_power_mul);
        const float selector_quality = powf(quality, 1.65f * quality_power_mul);

        //const uint max_endpoint_clusters = math::clamp<uint>(static_cast<uint>(m_endpoint_clusterizer.get_codebook_size() * endpoint_quality), 128U, m_endpoint_clusterizer.get_codebook_size());
        //const uint max_selector_clusters = math::clamp<uint>(static_cast<uint>(m_max_selector_clusters * selector_quality), 150U, m_max_selector_clusters);
        const uint max_endpoint_clusters = math::clamp<uint>(static_cast<uint>(m_endpoint_clusterizer.get_codebook_size() * endpoint_quality), 96U, m_endpoint_clusterizer.get_codebook_size());
        const uint max_selector_clusters = math::clamp<uint>(static_cast<uint>(m_max_selector_clusters * selector_quality), 128U, m_max_selector_clusters);

        if (quality >= 1.0f)
        {
            m_endpoint_cluster_indices.resize(m_num_blocks);
            for (uint i = 0; i < m_num_blocks; i++)
            {
                m_endpoint_cluster_indices[i].resize(1);
                m_endpoint_cluster_indices[i][0] = i;
            }
        }
        else
        {
            m_endpoint_clusterizer.retrieve_clusters(max_endpoint_clusters, m_endpoint_cluster_indices);
        }

        //      trace("endpoint clusters: %u\n", m_endpoint_cluster_indices.size());

        uint total_blocks = 0;
        uint max_blocks = 0;
        for (uint i = 0; i < m_endpoint_cluster_indices.size(); i++)
        {
            uint num = m_endpoint_cluster_indices[i].size();
            total_blocks += num;
            max_blocks = math::maximum(max_blocks, num);
        }
#if 0
      trace("Num clusters: %u, Average blocks per cluster: %u, Max blocks per cluster: %u\n",
         m_endpoint_cluster_indices.size(),
         total_blocks / m_endpoint_cluster_indices.size(),
         max_blocks);
#endif

        crnlib::vector<crnlib::vector<uint>>& selector_cluster_indices = m_cached_selector_cluster_indices[params.m_quality_level];

        m_progress_start = 0;
        if (quality >= 1.0f)
        {
            m_progress_range = 100;
        }
        else if (selector_cluster_indices.empty())
        {
            m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 33;
        }
        else
        {
            m_progress_range = (m_params.m_dxt_quality == cCRNDXTQualitySuperFast) ? 10 : 50;
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &qdxt1::pack_endpoints_task, i);
        }
        m_pTask_pool->join();

        if (m_canceled)
        {
            return false;
        }

        if (quality >= 1.0f)
        {
            return true;
        }

        if (selector_cluster_indices.empty())
        {
            create_selector_clusters(max_selector_clusters, selector_cluster_indices);

            if (m_canceled)
            {
                selector_cluster_indices.clear();

                return false;
            }
        }

        m_progress_start += m_progress_range;
        m_progress_range = 100 - m_progress_start;

        optimize_selectors_params optimize_selectors_task_params(selector_cluster_indices);

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &qdxt1::optimize_selectors_task, i, &optimize_selectors_task_params);
        }

        m_pTask_pool->join();

        return !m_canceled;
    }